

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.cpp
# Opt level: O0

ASTElement * __thiscall ninx::parser::element::Assignment::clone_impl(Assignment *this)

{
  Assignment *this_00;
  Block *local_10;
  Assignment *this_local;
  
  local_10 = (Block *)this;
  this_00 = (Assignment *)operator_new(0x40);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&this->value);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&stack0xffffffffffffffe8);
  Assignment(this_00,&this->name,
             (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&stack0xffffffffffffffe8);
  return (ASTElement *)this_00;
}

Assistant:

ninx::parser::element::ASTElement *ninx::parser::element::Assignment::clone_impl() {
    return new Assignment(this->name, this->value->clone<Expression>());
}